

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,bool value)

{
  char *begin;
  undefined7 in_register_00000031;
  
  begin = "false";
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    begin = "true";
  }
  buffer<char>::append<char>
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,begin,
             begin + (CONCAT71(in_register_00000031,value) & 0xffffffff ^ 5));
  return (buffer_appender<char>)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, bool value) {
  return write<Char>(out, string_view(value ? "true" : "false"));
}